

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
* __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
          (unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
           *__return_storage_ptr__,BinaryPolynomialModel<unsigned_int,_double> *this)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_long>,_false>_>_>
  local_10;
  
  if (this->relabel_flag_for_variables_to_integers_ == true) {
    GenerateVariablesToIntegers(__return_storage_ptr__,this);
  }
  else {
    (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->_M_h)._M_bucket_count =
         (this->variables_to_integers_)._M_h._M_bucket_count;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count =
         (this->variables_to_integers_)._M_h._M_element_count;
    uVar2 = *(undefined4 *)&(this->variables_to_integers_)._M_h._M_rehash_policy.field_0x4;
    sVar1 = (this->variables_to_integers_)._M_h._M_rehash_policy._M_next_resize;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor =
         (this->variables_to_integers_)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy.field_0x4 = uVar2;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = sVar1;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    local_10._M_h = (__hashtable_alloc *)__return_storage_ptr__;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,long>,std::allocator<std::pair<unsigned_int_const,long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,long>,std::allocator<std::pair<unsigned_int_const,long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,long>,false>>>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,long>,std::allocator<std::pair<unsigned_int_const,long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)__return_storage_ptr__,&(this->variables_to_integers_)._M_h,&local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<IndexType, int64_t> GetVariablesToIntegers() const {
      if ( relabel_flag_for_variables_to_integers_ ) {
        return GenerateVariablesToIntegers();
      } else {
        return variables_to_integers_;
      }
    }